

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O3

QTlsBackend * QSslSocketPrivate::tlsBackendInUse(void)

{
  QMutex QVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  Data *pDVar4;
  qsizetype qVar5;
  QTlsBackend *pQVar6;
  undefined4 *puVar7;
  QSslSocketPrivate *this;
  long in_FS_OFFSET;
  QObject local_60 [8];
  Data *local_58;
  char16_t *pcStack_50;
  qsizetype local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((QBasicAtomicPointer<QMutexPrivate>)backendMutex.super_QBasicMutex.d_ptr._q_value._M_b._M_p ==
      (__base_type)0x0) {
    LOCK();
    backendMutex.super_QBasicMutex.d_ptr._q_value._M_b._M_p =
         (QBasicMutex)(QBasicAtomicPointer<QMutexPrivate>)0x1;
    UNLOCK();
  }
  else {
    QBasicMutex::lockInternal();
  }
  pQVar6 = tlsBackend;
  if (tlsBackend != (QTlsBackend *)0x0) goto LAB_0024dc63;
  if (activeBackendName.d.size == 0) {
    QTlsBackend::defaultBackendName();
    qVar5 = local_48;
    pDVar4 = local_58;
    pcVar3 = activeBackendName.d.ptr;
    pDVar2 = activeBackendName.d.d;
    local_58 = activeBackendName.d.d;
    activeBackendName.d.d = pDVar4;
    activeBackendName.d.ptr = pcStack_50;
    pcStack_50 = pcVar3;
    local_48 = activeBackendName.d.size;
    activeBackendName.d.size = qVar5;
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&pDVar2->super_QArrayData,2,0x10);
      }
    }
    if (activeBackendName.d.size != 0) goto LAB_0024dbc7;
    this = (QSslSocketPrivate *)QtPrivateLogging::lcSsl();
    if (((this->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.field_0x11 & 1) != 0) {
      tlsBackendInUse(this);
    }
  }
  else {
LAB_0024dbc7:
    pQVar6 = QTlsBackend::findBackend(&activeBackendName);
    tlsBackend = pQVar6;
    if (pQVar6 != (QTlsBackend *)0x0) {
      local_58 = (Data *)QObject::destroyed;
      pcStack_50 = (char16_t *)0x0;
      puVar7 = (undefined4 *)operator_new(0x10);
      *puVar7 = 1;
      *(code **)(puVar7 + 2) =
           QtPrivate::
           QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/network/ssl/qsslsocket.cpp:3110:71),_QtPrivate::List<>,_void>
           ::impl;
      QObject::connectImpl
                (local_60,(void **)pQVar6,(QObject *)&local_58,(void **)pQVar6,
                 (QSlotObjectBase *)0x0,(ConnectionType)puVar7,(int *)0x1,(QMetaObject *)0x0);
      QMetaObject::Connection::~Connection((Connection *)local_60);
      pQVar6 = tlsBackend;
      goto LAB_0024dc63;
    }
  }
  pQVar6 = (QTlsBackend *)0x0;
LAB_0024dc63:
  QVar1.super_QBasicMutex.d_ptr._q_value._M_b._M_p =
       backendMutex.super_QBasicMutex.d_ptr._q_value._M_b._M_p;
  LOCK();
  backendMutex.super_QBasicMutex.d_ptr._q_value._M_b._M_p =
       (QBasicMutex)(QBasicAtomicPointer<QMutexPrivate>)0x0;
  UNLOCK();
  if ((QBasicAtomicPointer<QMutexPrivate>)QVar1.super_QBasicMutex.d_ptr._q_value._M_b._M_p !=
      (__base_type)0x1) {
    QBasicMutex::unlockInternalFutex(&backendMutex);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return pQVar6;
  }
  __stack_chk_fail();
}

Assistant:

QTlsBackend *QSslSocketPrivate::tlsBackendInUse()
{
    const QMutexLocker locker(&backendMutex);
    if (tlsBackend)
        return tlsBackend;

    if (!activeBackendName.size())
        activeBackendName = QTlsBackend::defaultBackendName();

    if (!activeBackendName.size()) {
        qCWarning(lcSsl, "No functional TLS backend was found");
        return nullptr;
    }

    tlsBackend = QTlsBackend::findBackend(activeBackendName);
    if (tlsBackend) {
        QObject::connect(tlsBackend, &QObject::destroyed, tlsBackend, [] {
            const QMutexLocker locker(&backendMutex);
            tlsBackend = nullptr;
        },
        Qt::DirectConnection);
    }
    return tlsBackend;
}